

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_SQcd_SQcc
                   (opj_j2k_t *p_j2k,OPJ_UINT32 p_comp_no,OPJ_BYTE *p_header_data,
                   OPJ_UINT32 *p_header_size,opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *pOVar1;
  int local_7c;
  uint local_74;
  opj_tcp_t *local_70;
  uint local_68;
  uint local_64;
  OPJ_UINT32 l_num_band;
  OPJ_UINT32 l_tmp;
  OPJ_BYTE *l_current_ptr;
  opj_tccp_t *l_tccp;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  opj_event_mgr_t *poStack_38;
  OPJ_UINT32 l_band_no;
  opj_event_mgr_t *p_manager_local;
  OPJ_UINT32 *p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *poStack_18;
  OPJ_UINT32 p_comp_no_local;
  opj_j2k_t *p_j2k_local;
  
  l_tcp = (opj_tcp_t *)0x0;
  l_tccp = (opj_tccp_t *)0x0;
  l_current_ptr = (OPJ_BYTE *)0x0;
  _l_num_band = (OPJ_BYTE *)0x0;
  poStack_38 = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_header_size;
  p_header_size_local = (OPJ_UINT32 *)p_header_data;
  p_header_data_local._4_4_ = p_comp_no;
  poStack_18 = p_j2k;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2b17,
                  "OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2b18,
                  "OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2b19,
                  "OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  l_tcp = (opj_tcp_t *)&p_j2k->m_cp;
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    local_70 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    local_70 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  l_tccp = (opj_tccp_t *)local_70;
  if (p_j2k->m_private_image->numcomps <= p_comp_no) {
    __assert_fail("p_comp_no < p_j2k->m_private_image->numcomps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2b23,
                  "OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  l_current_ptr = (OPJ_BYTE *)(local_70->tccps + p_comp_no);
  _l_num_band = p_header_data;
  if (*p_header_size == 0) {
    opj_event_msg(p_manager,1,"Error reading SQcd or SQcc element\n");
    p_j2k_local._4_4_ = 0;
  }
  else {
    *p_header_size = *p_header_size - 1;
    opj_read_bytes_LE(p_header_data,&local_64,1);
    _l_num_band = _l_num_band + 1;
    *(uint *)(l_current_ptr + 0x18) = local_64 & 0x1f;
    *(uint *)(l_current_ptr + 0x324) = local_64 >> 5;
    if (*(int *)(l_current_ptr + 0x18) == 1) {
      local_68 = 1;
    }
    else {
      if (*(int *)(l_current_ptr + 0x18) == 0) {
        local_74 = *(uint *)&p_manager_local->m_error_data;
      }
      else {
        local_74 = *(uint *)&p_manager_local->m_error_data >> 1;
      }
      local_68 = local_74;
      if (0x61 < local_74) {
        opj_event_msg(poStack_38,2,
                      "While reading CCP_QNTSTY element inside QCD or QCC marker segment, number of subbands (%d) is greater to OPJ_J2K_MAXBANDS (%d). So we limit the number of elements stored to OPJ_J2K_MAXBANDS (%d) and skip the rest. \n"
                      ,(ulong)local_74,0x61);
      }
    }
    if (*(int *)(l_current_ptr + 0x18) == 0) {
      for (l_cp._4_4_ = 0; l_cp._4_4_ < local_68; l_cp._4_4_ = l_cp._4_4_ + 1) {
        opj_read_bytes_LE(_l_num_band,&local_64,1);
        _l_num_band = _l_num_band + 1;
        if (l_cp._4_4_ < 0x61) {
          *(uint *)(l_current_ptr + (ulong)l_cp._4_4_ * 8 + 0x1c) = local_64 >> 3;
          pOVar1 = l_current_ptr + (ulong)l_cp._4_4_ * 8 + 0x20;
          pOVar1[0] = '\0';
          pOVar1[1] = '\0';
          pOVar1[2] = '\0';
          pOVar1[3] = '\0';
        }
      }
      *(uint *)&p_manager_local->m_error_data = *(int *)&p_manager_local->m_error_data - local_68;
    }
    else {
      for (l_cp._4_4_ = 0; l_cp._4_4_ < local_68; l_cp._4_4_ = l_cp._4_4_ + 1) {
        opj_read_bytes_LE(_l_num_band,&local_64,2);
        _l_num_band = _l_num_band + 2;
        if (l_cp._4_4_ < 0x61) {
          *(uint *)(l_current_ptr + (ulong)l_cp._4_4_ * 8 + 0x1c) = local_64 >> 0xb;
          *(uint *)(l_current_ptr + (ulong)l_cp._4_4_ * 8 + 0x20) = local_64 & 0x7ff;
        }
      }
      *(uint *)&p_manager_local->m_error_data =
           *(int *)&p_manager_local->m_error_data + local_68 * -2;
    }
    if (*(int *)(l_current_ptr + 0x18) == 1) {
      for (l_cp._4_4_ = 1; l_cp._4_4_ < 0x61; l_cp._4_4_ = l_cp._4_4_ + 1) {
        if ((int)(*(int *)(l_current_ptr + 0x1c) - (l_cp._4_4_ - 1) / 3) < 1) {
          local_7c = 0;
        }
        else {
          local_7c = *(int *)(l_current_ptr + 0x1c) - (l_cp._4_4_ - 1) / 3;
        }
        *(int *)(l_current_ptr + (ulong)l_cp._4_4_ * 8 + 0x1c) = local_7c;
        *(undefined4 *)(l_current_ptr + (ulong)l_cp._4_4_ * 8 + 0x20) =
             *(undefined4 *)(l_current_ptr + 0x20);
      }
    }
    p_j2k_local._4_4_ = 1;
  }
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *p_j2k,
                                       OPJ_UINT32 p_comp_no,
                                       OPJ_BYTE* p_header_data,
                                       OPJ_UINT32 * p_header_size,
                                       opj_event_mgr_t * p_manager
                                      )
{
    /* loop*/
    OPJ_UINT32 l_band_no;
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    opj_tccp_t *l_tccp = 00;
    OPJ_BYTE * l_current_ptr = 00;
    OPJ_UINT32 l_tmp, l_num_band;

    /* preconditions*/
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_header_data != 00);

    l_cp = &(p_j2k->m_cp);
    /* come from tile part header or main header ?*/
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH)
            ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    /* precondition again*/
    assert(p_comp_no <  p_j2k->m_private_image->numcomps);

    l_tccp = &l_tcp->tccps[p_comp_no];
    l_current_ptr = p_header_data;

    if (*p_header_size < 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading SQcd or SQcc element\n");
        return OPJ_FALSE;
    }
    *p_header_size -= 1;

    opj_read_bytes(l_current_ptr, &l_tmp, 1);                       /* Sqcx */
    ++l_current_ptr;

    l_tccp->qntsty = l_tmp & 0x1f;
    l_tccp->numgbits = l_tmp >> 5;
    if (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) {
        l_num_band = 1;
    } else {
        l_num_band = (l_tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) ?
                     (*p_header_size) :
                     (*p_header_size) / 2;

        if (l_num_band > OPJ_J2K_MAXBANDS) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "While reading CCP_QNTSTY element inside QCD or QCC marker segment, "
                          "number of subbands (%d) is greater to OPJ_J2K_MAXBANDS (%d). So we limit the number of elements stored to "
                          "OPJ_J2K_MAXBANDS (%d) and skip the rest. \n", l_num_band, OPJ_J2K_MAXBANDS,
                          OPJ_J2K_MAXBANDS);
            /*return OPJ_FALSE;*/
        }
    }

#ifdef USE_JPWL
    if (l_cp->correct) {

        /* if JPWL is on, we check whether there are too many subbands */
        if (/*(l_num_band < 0) ||*/ (l_num_band >= OPJ_J2K_MAXBANDS)) {
            opj_event_msg(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
                          "JPWL: bad number of subbands in Sqcx (%d)\n",
                          l_num_band);
            if (!JPWL_ASSUME) {
                opj_event_msg(p_manager, EVT_ERROR, "JPWL: giving up\n");
                return OPJ_FALSE;
            }
            /* we try to correct */
            l_num_band = 1;
            opj_event_msg(p_manager, EVT_WARNING, "- trying to adjust them\n"
                          "- setting number of bands to %d => HYPOTHESIS!!!\n",
                          l_num_band);
        };

    };
#endif /* USE_JPWL */

    if (l_tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
        for (l_band_no = 0; l_band_no < l_num_band; l_band_no++) {
            opj_read_bytes(l_current_ptr, &l_tmp, 1);                       /* SPqcx_i */
            ++l_current_ptr;
            if (l_band_no < OPJ_J2K_MAXBANDS) {
                l_tccp->stepsizes[l_band_no].expn = (OPJ_INT32)(l_tmp >> 3);
                l_tccp->stepsizes[l_band_no].mant = 0;
            }
        }
        *p_header_size = *p_header_size - l_num_band;
    } else {
        for (l_band_no = 0; l_band_no < l_num_band; l_band_no++) {
            opj_read_bytes(l_current_ptr, &l_tmp, 2);                       /* SPqcx_i */
            l_current_ptr += 2;
            if (l_band_no < OPJ_J2K_MAXBANDS) {
                l_tccp->stepsizes[l_band_no].expn = (OPJ_INT32)(l_tmp >> 11);
                l_tccp->stepsizes[l_band_no].mant = l_tmp & 0x7ff;
            }
        }
        *p_header_size = *p_header_size - 2 * l_num_band;
    }

    /* Add Antonin : if scalar_derived -> compute other stepsizes */
    if (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) {
        for (l_band_no = 1; l_band_no < OPJ_J2K_MAXBANDS; l_band_no++) {
            l_tccp->stepsizes[l_band_no].expn =
                ((OPJ_INT32)(l_tccp->stepsizes[0].expn) - (OPJ_INT32)((l_band_no - 1) / 3) > 0)
                ?
                (OPJ_INT32)(l_tccp->stepsizes[0].expn) - (OPJ_INT32)((l_band_no - 1) / 3) : 0;
            l_tccp->stepsizes[l_band_no].mant = l_tccp->stepsizes[0].mant;
        }
    }

    return OPJ_TRUE;
}